

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O2

key_type * __thiscall
nlohmann::detail::
iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::key(key_type *__return_storage_ptr__,
     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
     *this)

{
  invalid_iterator *__return_storage_ptr___00;
  allocator<char> local_39;
  string local_38;
  
  if (this->m_object->m_type == object) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)((this->m_it).object_iterator._M_node + 1)
              );
    return __return_storage_ptr__;
  }
  __return_storage_ptr___00 = (invalid_iterator *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"cannot use key() for non-object iterators",&local_39);
  invalid_iterator::create(__return_storage_ptr___00,0xcf,&local_38);
  __cxa_throw(__return_storage_ptr___00,&invalid_iterator::typeinfo,exception::~exception);
}

Assistant:

typename object_t::key_type key() const
{
assert(m_object != nullptr);

if (JSON_LIKELY(m_object->is_object()))
{
return m_it.object_iterator->first;
}

JSON_THROW(invalid_iterator::create(207, "cannot use key() for non-object iterators"));
}